

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosixSocketCommon.cpp
# Opt level: O2

void PosixSocketCommon::clearBuffer(int socket_fd,sockaddr *class_rfa,socklen_t class_rfa_size)

{
  int iVar1;
  ssize_t sVar2;
  char buf;
  pollfd polldata;
  
  polldata.events = 1;
  polldata.fd = socket_fd;
  while( true ) {
    iVar1 = poll((pollfd *)&polldata,1,0);
    if (iVar1 == -1) {
      return;
    }
    if (polldata.revents == 0) break;
    sVar2 = read(socket_fd,&buf,1);
    if ((int)sVar2 < 1) {
      return;
    }
  }
  return;
}

Assistant:

void PosixSocketCommon::clearBuffer(int       socket_fd,
                                    sockaddr* class_rfa,
                                    socklen_t class_rfa_size)
{
    // Interested if data is available
    pollfd polldata;
    polldata.fd = socket_fd;
    polldata.events = POLLIN;

    char buf;

    while(true)
    {
        // Poll the socket and see if there is data
        if (poll(&polldata, 1, 0) == -1)
        {
#if defined DEBUG
            perror("PosixSocketCommon::clearBuffer");
#endif
            return;
        }

        // If no data available, leave
        if (polldata.revents == 0)
        {
            return;
        }

        // Read a byte, leave if error
        if (read(socket_fd, &buf, 1, 0, class_rfa, class_rfa_size)
            < 1)
        {
            return;
        }
    }
}